

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Tags::Write(Tags *this,IMkvWriter *writer)

{
  bool bVar1;
  uint64_t uVar2;
  long lVar3;
  long lVar4;
  Tag *in_RSI;
  uint64 in_RDI;
  int64_t stop;
  uint64_t tag_size;
  Tag *tag_1;
  int idx_1;
  int64_t start;
  Tag *tag;
  int idx;
  uint64_t payload_size;
  uint64 in_stack_ffffffffffffff98;
  IMkvWriter *in_stack_ffffffffffffffa8;
  int local_3c;
  int local_24;
  IMkvWriter *writer_00;
  bool local_1;
  
  if (in_RSI == (Tag *)0x0) {
    local_1 = false;
  }
  else {
    writer_00 = (IMkvWriter *)0x0;
    for (local_24 = 0; local_24 < *(int *)(in_RDI + 4); local_24 = local_24 + 1) {
      uVar2 = Tag::Write(in_RSI,writer_00);
      writer_00 = (IMkvWriter *)((long)&writer_00->_vptr_IMkvWriter + uVar2);
    }
    bVar1 = WriteEbmlMasterElement(in_stack_ffffffffffffffa8,in_RDI,in_stack_ffffffffffffff98);
    if (bVar1) {
      lVar3 = (*(code *)in_RSI->simple_tags_->tag_string_)();
      for (local_3c = 0; local_3c < *(int *)(in_RDI + 4); local_3c = local_3c + 1) {
        uVar2 = Tag::Write(in_RSI,writer_00);
        if (uVar2 == 0) {
          return false;
        }
      }
      lVar4 = (*(code *)in_RSI->simple_tags_->tag_string_)();
      if ((lVar4 < lVar3) || ((IMkvWriter *)(lVar4 - lVar3) == writer_00)) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Tags::Write(IMkvWriter* writer) const {
  if (writer == NULL)
    return false;

  uint64_t payload_size = 0;

  for (int idx = 0; idx < tags_count_; ++idx) {
    const Tag& tag = tags_[idx];
    payload_size += tag.Write(NULL);
  }

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvTags, payload_size))
    return false;

  const int64_t start = writer->Position();

  for (int idx = 0; idx < tags_count_; ++idx) {
    const Tag& tag = tags_[idx];

    const uint64_t tag_size = tag.Write(writer);
    if (tag_size == 0)  // error
      return 0;
  }

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != payload_size)
    return false;

  return true;
}